

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_8::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  Own<const_kj::WritableFileMapping> OVar1;
  uint64_t size_local;
  uint64_t offset_local;
  DiskFile *this_local;
  
  OVar1 = DiskHandle::mmapWritable((DiskHandle *)this,offset + 8,size);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }